

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O1

void __thiscall
SuffixTest_VisitIntSuffixValues_Test::TestBody(SuffixTest_VisitIntSuffixValues_Test *this)

{
  char **ppcVar1;
  FunctionMocker<void_(int,_double)> *this_00;
  SuffixImpl *pSVar2;
  undefined8 *puVar3;
  MockSpec<void_(int,_int)> *pMVar4;
  StringRef name;
  MutIntSuffix s;
  MockValueVisitor v;
  SuffixBase local_150;
  Matcher<int> local_148;
  Matcher<int> local_130;
  MockValueVisitor local_118;
  
  ppcVar1 = &local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
             super_UntypedFunctionMockerBase.name_;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.mock_obj_ = (void *)0x0;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.name_._0_1_ = 0;
  name.size_ = 4;
  name.data_ = "test";
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase = (_func_int **)ppcVar1;
  pSVar2 = mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
                     (&(this->super_SuffixTest).suffixes_,name,0,3,(SuffixTable *)&local_118);
  puVar3 = (undefined8 *)operator_new(0xc);
  *(undefined4 *)(puVar3 + 1) = 0;
  *puVar3 = 0;
  (pSVar2->field_3).values = puVar3;
  local_150.impl_ = pSVar2;
  if (local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
      super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase != (_func_int **)ppcVar1) {
    operator_delete(local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                    super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase,
                    CONCAT71(local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._1_7_,
                             local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._0_1_) + 1);
  }
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_150,0,0x2a);
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_150,1,0);
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_150,2,0xb);
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_118);
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> +
       0x10);
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.value_ = (MatcherInterface<int> *)0x0;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> + 0x28
                );
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172d80;
  this_00 = &local_118.gmock2_Visit_147;
  local_118.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_(int,_int)> *)&local_118;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_
               .matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
       0x10);
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173058;
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
                0x28);
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172f88;
  local_118.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.
  function_mocker_ = &this_00->super_FunctionMockerBase<void_(int,_double)>;
  testing::Matcher<int>::Matcher(&local_130,0);
  testing::Matcher<int>::Matcher(&local_148,0x2a);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&local_118,&local_118);
  pMVar4 = testing::internal::FunctionMocker<void_(int,_int)>::With
                     (&local_118.gmock2_Visit_146,&local_130,&local_148);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0x9c,
             "v","Visit(0, Matcher<int>(42))");
  local_148.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_148.super_MatcherBase<int>.impl_);
  local_130.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_130.super_MatcherBase<int>.impl_);
  testing::Matcher<int>::Matcher(&local_130,2);
  testing::Matcher<int>::Matcher(&local_148,0xb);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&local_118,&local_118);
  pMVar4 = testing::internal::FunctionMocker<void_(int,_int)>::With
                     (&local_118.gmock2_Visit_146,&local_130,&local_148);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0x9d,
             "v","Visit(2, Matcher<int>(11))");
  local_148.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_148.super_MatcherBase<int>.impl_);
  local_130.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_130.super_MatcherBase<int>.impl_);
  mp::BasicSuffix<int>::VisitValues<MockValueVisitor>((BasicSuffix<int> *)&local_150,&local_118);
  testing::internal::FunctionMockerBase<void_(int,_double)>::~FunctionMockerBase
            (&this_00->super_FunctionMockerBase<void_(int,_double)>);
  testing::internal::FunctionMockerBase<void_(int,_int)>::~FunctionMockerBase
            ((FunctionMockerBase<void_(int,_int)> *)&local_118);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitIntSuffixValues) {
  mp::MutIntSuffix s = suffixes_.Add<int>("test", 0, 3);
  s.set_value(0, 42);
  s.set_value(1, 0);
  s.set_value(2, 11);
  MockValueVisitor v;
  EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
  EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
  s.VisitValues(v);
}